

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O3

const_iterator * __thiscall
pstore::index::
hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
::find<std::__cxx11::string,void>
          (const_iterator *__return_storage_ptr__,
          hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
          *this,database *db,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  const_iterator *pcVar5;
  uint64_t uVar6;
  const_iterator *extraout_RAX;
  const_iterator *extraout_RAX_00;
  unsigned_long extraout_RDX;
  unsigned_long uVar7;
  internal_node *piVar8;
  index_pointer *piVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar10;
  index_pointer node;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar11;
  key_type existing_key;
  parent_stack parents;
  undefined1 local_158 [32];
  index_pointer *local_138;
  index_pointer local_130;
  const_iterator *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  index_pointer local_118;
  index_pointer local_110;
  index_pointer local_108 [26];
  ulong local_38;
  
  bVar3 = hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(*(hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    **)(this + 0x18));
  if (bVar3) {
    __return_storage_ptr__->db_ = db;
    pcVar5 = (const_iterator *)memset(&__return_storage_ptr__->visited_parents_,0,0xd8);
    __return_storage_ptr__->index_ =
         (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this;
    (__return_storage_ptr__->pos_)._M_t.
    super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
    ._M_head_impl =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)0x0;
  }
  else {
    local_138 = (index_pointer *)__return_storage_ptr__;
    local_120 = key;
    uVar6 = anon_unknown.dwarf_18bb43::hash_function::operator()((hash_function *)(this + 0x28),key)
    ;
    node = *(index_pointer *)(this + 0x18);
    uVar10 = 0;
    local_128 = (const_iterator *)this;
    memset(local_108,0,0xd8);
    pVar11.second = extraout_RDX;
    pVar11.first.internal_ = node.internal_;
    if (((ulong)node.internal_ & 1) == 0) {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_130 = (index_pointer)db;
      do {
        if (uVar10 < 0x42) {
          details::internal_node::get_node
                    ((pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                      *)local_158,(database *)local_130.internal_,node);
          uVar2 = local_158._8_8_;
          local_158._0_8_ = (const_iterator *)0x0;
          local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          piVar8 = (internal_node *)local_158._16_8_;
          if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
             piVar8 = (internal_node *)local_158._16_8_,
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
          }
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
          if ((piVar8->bitmap_ >> (uVar6 & 0x3f) & 1) == 0) {
LAB_00179237:
            piVar9 = local_138;
            local_138->internal_ = (internal_node *)local_130;
            memset(local_138 + 1,0,0xd8);
            piVar9[0x1c].internal_ = (internal_node *)local_128;
            piVar9[0x1d].internal_ = (internal_node *)0x0;
            pcVar5 = local_128;
            goto LAB_001792e7;
          }
          uVar7 = POPCOUNT(piVar8->bitmap_ & (1L << ((byte)uVar6 & 0x3f)) - 1U);
          pVar11.second = uVar7;
          pVar11.first.internal_ = piVar8->children_[uVar7].internal_;
        }
        else {
          details::linear_node::get_node
                    ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                      *)local_158,(database *)local_130.internal_,node);
          uVar2 = local_158._8_8_;
          local_158._0_8_ = (const_iterator *)0x0;
          local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          piVar8 = (internal_node *)local_158._16_8_;
          if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
             piVar8 = (internal_node *)local_158._16_8_,
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
          }
          pVar11 = details::linear_node::
                   lookup<std::__cxx11::string,std::__cxx11::string,std::equal_to<std::__cxx11::string>,void>
                             ((linear_node *)piVar8,local_130.internal_,local_120);
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
          if (pVar11.second == 0xffffffffffffffff) goto LAB_00179237;
        }
        if (0xc < local_38) {
          assert_failed("elements_ < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                        ,100);
        }
        local_108[local_38 * 2] = node;
        lVar1 = local_38 * 2;
        local_38 = local_38 + 1;
        local_108[lVar1 + 1] = (index_pointer)pVar11.second;
        uVar10 = uVar10 + 6;
        uVar6 = uVar6 >> 6;
        node = pVar11.first;
        db = (database *)local_130;
      } while (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0);
    }
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x2) != (undefined1  [16])0x0) {
      __assert_fail("is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                    ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
    }
    local_118 = (index_pointer)db;
    local_110 = pVar11.first;
    serialize::read<std::__cxx11::string,pstore::serialize::archive::database_reader>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
               (serialize *)&local_118.addr_,(database_reader *)pVar11.second);
    pcVar5 = local_128;
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ ==
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120->_M_string_length) &&
       (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ ==
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
        (iVar4 = bcmp((void *)local_158._0_8_,(local_120->_M_dataplus)._M_p,local_158._8_8_),
        iVar4 == 0)))) {
      piVar9 = local_138;
      if (0xc < local_38) {
        assert_failed("elements_ < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                      ,100);
      }
      local_108[local_38 * 2] = pVar11.first;
      lVar1 = local_38 * 2;
      local_38 = local_38 + 1;
      local_108[lVar1 + 1] = (index_pointer)0xffffffffffffffff;
      local_138->internal_ = (internal_node *)db;
      memcpy(local_138 + 1,local_108,0xd8);
    }
    else {
      piVar9 = local_138;
      local_138->internal_ = (internal_node *)db;
      memset(local_138 + 1,0,0xd8);
    }
    piVar9[0x1c].internal_ = (internal_node *)pcVar5;
    piVar9[0x1d].internal_ = (internal_node *)0x0;
    pcVar5 = (const_iterator *)(local_158 + 0x10);
    if ((const_iterator *)local_158._0_8_ != (const_iterator *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
      pcVar5 = extraout_RAX;
    }
LAB_001792e7:
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      pcVar5 = extraout_RAX_00;
    }
  }
  return pcVar5;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::find (database const & db,
                                                                 OtherKeyType const & key) const
            -> const_iterator {
            if (empty ()) {
                return this->cend (db);
            }

            auto hash = static_cast<hash_type> (hash_ (key));
            unsigned bit_shifts = 0;
            index_pointer node = root_;
            parent_stack parents;

            std::shared_ptr<void const> store_node;
            while (!node.is_leaf ()) {
                index_pointer child_node;
                auto index = std::size_t{0};

                if (details::depth_is_internal_node (bit_shifts)) {
                    // It's an internal node.
                    internal_node const * internal = nullptr;
                    std::tie (store_node, internal) = internal_node::get_node (db, node);
                    std::tie (child_node, index) =
                        internal->lookup (hash & details::hash_index_mask);
                } else {
                    // It's a linear node.
                    linear_node const * linear = nullptr;
                    std::tie (store_node, linear) = linear_node::get_node (db, node);
                    std::tie (child_node, index) = linear->lookup<KeyType> (db, key, equal_);
                }

                if (index == details::not_found) {
                    return this->cend (db);
                }
                parents.push (details::parent_type{node, index});

                // Go to next sub-trie level
                node = child_node;
                bit_shifts += details::hash_index_bits;
                hash >>= details::hash_index_bits;
            }
            // It's a leaf node.
            PSTORE_ASSERT (node.is_leaf ());
            key_type const existing_key = get_key (db, node.to_address ());
            if (equal_ (existing_key, key)) {
                parents.push (details::parent_type{node});
                return const_iterator (db, std::move (parents), this);
            }
            return this->cend (db);
        }